

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>
                    (string *type,ModulePtr *m)

{
  Type_Info ti;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  ModulePtr MVar1;
  Module *in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  allocator *paVar2;
  offset_in_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_to_subr
  in_stack_fffffffffffffa10;
  anon_class_1_0_00000001 *in_stack_fffffffffffffa18;
  ModulePtr *in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa48;
  ModulePtr *in_stack_fffffffffffffa58;
  ModulePtr *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa68;
  ModulePtr *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  ModulePtr *in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffab8;
  ModulePtr *in_stack_fffffffffffffaf8;
  allocator local_4a1;
  string local_4a0 [63];
  allocator local_461;
  string local_460 [63];
  allocator local_421;
  string local_420 [63];
  allocator local_3e1;
  string local_3e0 [63];
  allocator local_3a1;
  string local_3a0 [63];
  allocator local_361;
  string local_360 [63];
  allocator local_321;
  string local_320 [63];
  allocator local_2e1;
  string local_2e0 [63];
  allocator local_2a1;
  string local_2a0 [63];
  allocator local_261;
  string local_260 [63];
  allocator local_221;
  string local_220 [63];
  allocator local_1e1;
  string local_1e0 [64];
  string local_1a0 [32];
  code *local_180;
  undefined8 local_178;
  string local_50 [32];
  string *local_30;
  Module *pMStack_28;
  Proxy_Function *local_20;
  string *local_10;
  
  local_10 = in_RSI;
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3579ea);
  user_type<std::__cxx11::string>();
  std::__cxx11::string::string(local_50,local_10);
  ti.m_bare_type_info = (type_info *)in_stack_fffffffffffffa08;
  ti.m_type_info = (type_info *)in_stack_fffffffffffffa00;
  ti._16_8_ = in_stack_fffffffffffffa10;
  Module::add(pMStack_28,ti,local_30);
  std::__cxx11::string::~string(local_50);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  operators::addition<std::__cxx11::string>(in_stack_fffffffffffffa58);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357a9b);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357aa8);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  operators::assign_sum<std::__cxx11::string>(in_stack_fffffffffffffa58);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357ae9);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357af6);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  opers_comparison<std::__cxx11::string>(in_stack_fffffffffffffaf8);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357b37);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357b44);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  random_access_container_type<std::__cxx11::string>
            (in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357b9d);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357baa);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  sequence_type<std::__cxx11::string>(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357c03);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357c10);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  default_constructible_type<std::__cxx11::string>
            (in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357c69);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357c76);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  assignable_type<std::__cxx11::string>(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357ccf);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357cdc);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  input_range_type<std::__cxx11::string>(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357d35);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x357d42);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x357d4f);
  local_180 = std::__cxx11::string::push_back;
  local_178 = 0;
  fun<void,std::__cxx11::string,char>(in_stack_fffffffffffffa10);
  string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)
  ::{lambda()#1}::operator()[abi_cxx11_(in_stack_fffffffffffffa18);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_1a0);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x357ddf);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x357dec);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_1_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_1e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"find",paVar2);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x357e82);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x357e8f);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_2_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"rfind",&local_221);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x357f25);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x357f32);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_3_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"find_first_of",paVar2);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x357fc8);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x357fd5);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_4_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"find_last_of",&local_2a1);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35806b);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x358078);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_5_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"find_last_not_of",&local_2e1);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35810e);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35811b);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_6_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"find_first_not_of",paVar2);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3581ab);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3581b8);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string*)_1_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"clear",paVar2);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x358242);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35824f);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_1_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_3a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"empty",paVar2);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3582d9);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3582e6);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_2_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"size",&local_3e1);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x358370);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35837d);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_3_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"c_str",&local_421);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x358407);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x358414);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_4_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_461;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"data",paVar2);
  Module::add(in_stack_fffffffffffffa00,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x35849e);
  this = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x3584ab);
  fun<chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,unsigned_long,unsigned_long)_1_>
            ((anon_class_1_0_00000001_for_m_f *)local_30);
  paVar2 = &local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"substr",paVar2);
  Module::add(this,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x358535);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr string_type(const std::string &type, ModulePtr m = std::make_shared<Module>())
        {
          m->add(user_type<String>(), type);
          operators::addition<String>(m);
          operators::assign_sum<String>(m);
          opers_comparison<String>(m);
          random_access_container_type<String>(type, m);
          sequence_type<String>(type, m);
          default_constructible_type<String>(type, m);
          // container_type<String>(type, m);
          assignable_type<String>(type, m);
          input_range_type<String>(type, m);

          //Special case: add push_back to string (which doesn't support other back_insertion operations
          m->add(fun(&String::push_back), 
              []()->std::string{
                if (typeid(typename String::value_type) == typeid(Boxed_Value)) {
                  return "push_back_ref";
                } else {
                  return "push_back";
                }
              }());


          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find(f, pos); } ), "find");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->rfind(f, pos); } ), "rfind");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_of(f, pos); } ), "find_first_of");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_of(f, pos); } ), "find_last_of");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_not_of(f, pos); } ), "find_last_not_of");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_not_of(f, pos); } ), "find_first_not_of");

          m->add(fun([](String *s) { s->clear(); } ), "clear");
          m->add(fun([](const String *s) { return s->empty(); } ), "empty");
          m->add(fun([](const String *s) { return s->size(); } ), "size");

          m->add(fun([](const String *s) { return s->c_str(); } ), "c_str");
          m->add(fun([](const String *s) { return s->data(); } ), "data");
          m->add(fun([](const String *s, size_t pos, size_t len) { return s->substr(pos, len); } ), "substr");

          return m;
        }